

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O1

void Res_SimCountResults(Res_Sim_t *p,int *pnDcs,int *pnOnes,int *pnZeros,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  int *piVar9;
  double dVar10;
  
  pVVar4 = p->pAig->vPos;
  iVar1 = pVVar4->nSize;
  if (0 < iVar1) {
    ppvVar5 = pVVar4->pArray;
    iVar2 = *(int *)((long)*ppvVar5 + 0x10);
    if (-1 < (long)iVar2) {
      iVar3 = p->vPats->nSize;
      if ((iVar2 < iVar3) && (iVar1 != 1)) {
        iVar1 = *(int *)((long)ppvVar5[1] + 0x10);
        if ((-1 < (long)iVar1) && (iVar1 < iVar3)) {
          if (0 < p->nBytesIn) {
            ppvVar5 = p->vPats->pArray;
            pvVar6 = ppvVar5[iVar2];
            pvVar7 = ppvVar5[iVar1];
            lVar8 = 0;
            do {
              piVar9 = pnDcs;
              if ((*(char *)((long)pvVar6 + lVar8) != '\0') &&
                 (piVar9 = pnZeros, *(char *)((long)pvVar7 + lVar8) != '\0')) {
                piVar9 = pnOnes;
              }
              *piVar9 = *piVar9 + 1;
              lVar8 = lVar8 + 1;
            } while (lVar8 < p->nBytesIn);
          }
          if (fVerbose != 0) {
            dVar10 = (double)(*pnZeros + *pnDcs + *pnOnes);
            printf("Dc = %7.2f %%  ",((double)*pnDcs * 100.0) / dVar10);
            printf("On = %7.2f %%  ",((double)*pnOnes * 100.0) / dVar10);
            printf("Off = %7.2f %%  ",((double)*pnZeros * 100.0) / dVar10);
            return;
          }
          return;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Res_SimCountResults( Res_Sim_t * p, int * pnDcs, int * pnOnes, int * pnZeros, int fVerbose )
{
    unsigned char * pInfoCare, * pInfoNode;
    int i, nTotal = 0;
    pInfoCare = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 0)->Id );
    pInfoNode = (unsigned char *)Vec_PtrEntry( p->vPats, Abc_NtkPo(p->pAig, 1)->Id );
    for ( i = 0; i < p->nBytesIn; i++ )
    {
        if ( !pInfoCare[i] )
            (*pnDcs)++;
        else if ( !pInfoNode[i] )
            (*pnZeros)++;
        else
            (*pnOnes)++;
    }
    nTotal += *pnDcs;
    nTotal += *pnZeros;
    nTotal += *pnOnes;
    if ( fVerbose )
    {
        printf( "Dc = %7.2f %%  ",  100.0*(*pnDcs)  /nTotal );
        printf( "On = %7.2f %%  ",  100.0*(*pnOnes) /nTotal );
        printf( "Off = %7.2f %%  ", 100.0*(*pnZeros)/nTotal );
    }
}